

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews_p.h
# Opt level: O2

Role __thiscall QAccessibleTable::cellRole(QAccessibleTable *this)

{
  Role RVar1;
  
  RVar1 = this->m_role;
  if (RVar1 == Tree) {
    RVar1 = TreeItem;
  }
  else if (RVar1 == List) {
    RVar1 = ListItem;
  }
  else {
    if (RVar1 != Table) {
      return NoRole;
    }
    RVar1 = Cell;
  }
  return RVar1;
}

Assistant:

inline QAccessible::Role cellRole() const {
        switch (m_role) {
        case QAccessible::List:
            return QAccessible::ListItem;
        case QAccessible::Table:
            return QAccessible::Cell;
        case QAccessible::Tree:
            return QAccessible::TreeItem;
        default:
            Q_ASSERT(0);
        }
        return QAccessible::NoRole;
    }